

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audio_io.c
# Opt level: O0

ACODEC_TABLE * find_acodec_table_entry(char *ext)

{
  int iVar1;
  ulong uVar2;
  ACODEC_TABLE *pAVar3;
  undefined8 in_RDI;
  uint i;
  ACODEC_TABLE *ent;
  uint local_1c;
  
  if (!acodec_inited) {
    acodec_inited = true;
    _al_add_exit_func(acodec_shutdown,"acodec_shutdown");
  }
  local_1c = 0;
  while( true ) {
    uVar2 = _al_vector_size(&acodec_table);
    if (uVar2 <= local_1c) {
      return (ACODEC_TABLE *)0x0;
    }
    pAVar3 = (ACODEC_TABLE *)_al_vector_ref(&acodec_table,local_1c);
    iVar1 = _al_stricmp(pAVar3,in_RDI);
    if (iVar1 == 0) break;
    local_1c = local_1c + 1;
  }
  return pAVar3;
}

Assistant:

static ACODEC_TABLE *find_acodec_table_entry(const char *ext)
{
   ACODEC_TABLE *ent;
   unsigned i;

   if (!acodec_inited) {
      acodec_inited = true;
      _al_add_exit_func(acodec_shutdown, "acodec_shutdown");
   }

   for (i = 0; i < _al_vector_size(&acodec_table); i++) {
      ent = _al_vector_ref(&acodec_table, i);
      if (0 == _al_stricmp(ent->ext, ext)) {
         return ent;
      }
   }

   return NULL;
}